

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O1

void __thiscall http::Page::DumpData(Page *this,char *buffer,size_t length)

{
  ostream *poVar1;
  ostream *poVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  bool bVar8;
  string local_60;
  char *local_40;
  ulong local_38;
  
  poVar2 = &this->m_ostream;
  local_40 = buffer;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<code>\n",7);
  if (length != 0) {
    uVar3 = length - 1;
    uVar5 = 0;
    pcVar7 = local_40;
    do {
      to_hex<unsigned_short>(&local_60,(unsigned_short)uVar5,4);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                                  (char)local_60._M_dataplus._M_p),
                          local_60._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
          &local_60.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p),
                        local_60.field_2._M_allocated_capacity + 1);
      }
      lVar6 = 0x10;
      local_38 = uVar5;
      do {
        if (uVar5 < length) {
          to_hex<char>(&local_60,local_40[uVar5],2);
          poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar2,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                                      (char)local_60._M_dataplus._M_p),
                              local_60._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
              &local_60.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p
                                    ),local_60.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   ",3);
        }
        if (lVar6 == 9) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"- ",2);
        }
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  ",2);
      uVar5 = 0;
      do {
        if ((byte)(pcVar7[uVar5] + 0x81U) < 0xa1) {
          pcVar4 = ".";
        }
        else {
          pcVar4 = (char *)&local_60;
          local_60._M_dataplus._M_p._0_1_ = pcVar7[uVar5];
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,1);
      } while ((uVar3 != uVar5) && (bVar8 = uVar5 < 0xf, uVar5 = uVar5 + 1, bVar8));
      uVar5 = local_38 + 0x10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<br>\n",5);
      pcVar7 = pcVar7 + 0x10;
      uVar3 = uVar3 - 0x10;
    } while (uVar5 < length);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"</code>\n",8);
  return;
}

Assistant:

void http::Page::DumpData(const char* buffer, size_t length)
{
    size_t i;
    size_t j;
    std::ostream& out = get_output_stream();

    i = 0;
    j = 0;
    out << "<code>\n";
    while (i + 1 <= length)
    {
        out << to_hex((uint16_t)i) << " ";
        for (j = 0; j < 16; j++)
        {
            if (i + j < length)
            {
                out << to_hex(buffer[i + j]) << " ";
            }
            else
            {
                out << "   ";
            }

            if (j == 7)
            {
                out << "- ";
            }
        }
        out << "  ";
        for (j = 0; j < 16; j++)
        {
            if (buffer[i + j] >= 0x20 && buffer[i + j] <= 0x7E)
            {
                out << buffer[i + j];
            }
            else
            {
                out << ".";
            }
            if (i + j + 1 == length)
            {
                break;
            }
        }

        i += 16;

        out << "<br>\n";
    }
    out << "</code>\n";
}